

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

void __thiscall
compiler::CompilerAstWalker::onEnterBreakStatementAstNode
          (CompilerAstWalker *this,BreakStatementAstNode *param_1)

{
  pointer *ppuVar1;
  element_type *peVar2;
  pointer puVar3;
  pointer puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  iterator __position;
  element_type *this_00;
  element_type *peVar7;
  undefined8 uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__tmp;
  long lVar9;
  ulong uVar10;
  _Hash_node_base *p_Var11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  bool bVar14;
  string local_60;
  unsigned_long local_40;
  size_t breakIndex;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> vec;
  
  peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar3 = (peVar2->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (peVar2->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "onEnterBreakStatementAstNode encountered break statement but loopStartIndices empty",
             "");
  Error::assertWithPanic(puVar3 != puVar4,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,(ulong)(local_60.field_2._M_allocated_capacity + 1));
  }
  peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_40 = (long)(peVar2->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar2->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  puVar3 = (peVar2->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (peVar2->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)puVar4 - (long)puVar3 >> 3;
  if (puVar4 == puVar3) {
    uVar8 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       lVar9 + -1);
    __clang_call_terminate(uVar8);
  }
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)puVar3[lVar9 + -1];
  uVar6 = (peVar2->breakStatementsForLoops)._M_h._M_bucket_count;
  uVar10 = (ulong)paVar5 % uVar6;
  p_Var12 = (peVar2->breakStatementsForLoops)._M_h._M_buckets[uVar10];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var11 = p_Var12->_M_nxt, p_Var13 = p_Var12,
     paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)p_Var12->_M_nxt[1]._M_nxt)) {
    while (p_Var12 = p_Var11, p_Var11 = p_Var12->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var11[1]._M_nxt % uVar6 != uVar10) ||
         (p_Var13 = p_Var12,
         paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)p_Var11[1]._M_nxt)) goto LAB_0011ab5e;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_0011ab5e:
  if (p_Var13 == (__node_base_ptr)0x0) {
    p_Var11 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var11 = p_Var13->_M_nxt;
  }
  breakIndex = 0;
  vec.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  if (p_Var11 == (_Hash_node_base *)0x0) {
    peVar7 = (element_type *)operator_new(0x28);
    this_00 = vec.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (peVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x100000001;
    (peVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR___Sp_counted_ptr_inplace_00130a70;
    breakIndex = (size_t)&(peVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (peVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    peVar7[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    peVar7[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar14 = vec.
             super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr != (element_type *)0x0;
    vec.
    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar7;
    if (bVar14) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_60._M_string_length = breakIndex;
    local_60.field_2._M_allocated_capacity =
         (size_type)
         vec.
         super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    if (vec.
        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppuVar1 = &((vec.
                     super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
        UNLOCK();
      }
      else {
        ppuVar1 = &((vec.
                     super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
      }
    }
    local_60._M_dataplus._M_p = (pointer)paVar5;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<unsigned_long,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&peVar2->breakStatementsForLoops,&local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.field_2._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_60.field_2._M_allocated_capacity);
    }
  }
  else {
    breakIndex = (size_t)p_Var11[2]._M_nxt;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vec,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var11 + 3));
  }
  __position._M_current = *(unsigned_long **)(breakIndex + 8);
  if (__position._M_current == *(unsigned_long **)(breakIndex + 0x10)) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)breakIndex,__position,
               &local_40);
  }
  else {
    *__position._M_current = local_40;
    *(unsigned_long **)(breakIndex + 8) = __position._M_current + 1;
  }
  emit(this,Jump);
  if (vec.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               vec.
               super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  return;
}

Assistant:

void onEnterBreakStatementAstNode(BreakStatementAstNode*  /*node*/) noexcept override {
    Error::assertWithPanic(!this->ec->loopStartIndices.empty(),
      "onEnterBreakStatementAstNode encountered break statement but loopStartIndices empty");

    std::size_t breakIndex = this->ec->byteCode.size();
    std::size_t loopIndex = this->ec->loopStartIndices.at(this->ec->loopStartIndices.size() - 1);

    auto find = this->ec->breakStatementsForLoops.find(loopIndex);

    std::shared_ptr<std::vector<std::size_t>> vec = nullptr;

    if (find == this->ec->breakStatementsForLoops.end()) {
      vec = std::make_shared<std::vector<std::size_t>>();
      this->ec->breakStatementsForLoops.insert(std::make_pair(loopIndex, vec));
    } else {
      vec = find->second;
    }

    vec->push_back(breakIndex);

    this->emit(bytecode::ByteCodeInstruction::Jump);
  }